

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

void __thiscall
p2t::Sweep::FillRightBelowEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  double dVar1;
  Point *pa;
  Orientation OVar2;
  
  while( true ) {
    pa = node->point;
    dVar1 = edge->p->x;
    if (dVar1 < pa->x || dVar1 == pa->x) {
      return;
    }
    OVar2 = Orient2d(pa,node->next->point,node->next->next->point);
    if (OVar2 == CCW) break;
    FillRightConvexEdgeEvent(this,tcx,edge,node);
  }
  FillRightConcaveEdgeEvent(this,tcx,edge,node);
  return;
}

Assistant:

void Sweep::FillRightBelowEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  if (node.point->x < edge->p->x) {
    if (Orient2d(*node.point, *node.next->point, *node.next->next->point) == CCW) {
      // Concave
      FillRightConcaveEdgeEvent(tcx, edge, node);
    } else{
      // Convex
      FillRightConvexEdgeEvent(tcx, edge, node);
      // Retry this one
      FillRightBelowEdgeEvent(tcx, edge, node);
    }
  }
}